

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *out_combined,vec4<float> *out_combined_inverted,
          vec4<float> *out_constant,vec4<float> *out_constant_inverted,vec4<float> *out_dynamic,
          vec4<float> *out_dynamic_inverted,vec4<float> *out_loop)

{
  GLuint function;
  GLuint function_00;
  GLuint function_01;
  GLuint function_02;
  vec4<float> *right_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  GLuint dynamic_combination [4];
  vec4<float> combined;
  vec4<float> dynamic_inverted;
  vec4<float> dynamic;
  vec4<float> constant_inverted;
  vec4<float> constant;
  vec4<float> combined_inverted;
  vec4<float> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  dynamic_combination[0] = combination[indices->m_x];
  dynamic_combination[1] = combination[indices->m_y];
  dynamic_combination[2] = combination[indices->m_z];
  dynamic_combination[3] = combination[indices->m_w];
  right_00 = &local_78;
  local_78.m_x = -5.0;
  local_78.m_y = -6.0;
  local_78.m_z = -7.0;
  local_78.m_w = -8.0;
  local_68 = 0xc0000000bf800000;
  uStack_60 = 0xc0800000c0400000;
  local_58 = 0x40c0000040a00000;
  uStack_50 = 0x4100000040e00000;
  local_48 = 0x400000003f800000;
  uStack_40 = 0x4080000040400000;
  combined.m_x = left->m_x;
  combined.m_y = left->m_y;
  combined.m_z = left->m_z;
  combined.m_w = left->m_w;
  combined_inverted.m_x = left->m_x;
  combined_inverted.m_y = left->m_y;
  combined_inverted.m_z = left->m_z;
  combined_inverted.m_w = left->m_w;
  constant.m_x = 1.0;
  constant.m_y = 2.0;
  constant.m_z = 3.0;
  constant.m_w = 4.0;
  constant_inverted.m_x = 1.0;
  constant_inverted.m_y = 2.0;
  constant_inverted.m_z = 3.0;
  constant_inverted.m_w = 4.0;
  dynamic.m_x = left->m_x;
  dynamic.m_y = left->m_y;
  dynamic.m_z = left->m_z;
  dynamic.m_w = left->m_w;
  dynamic_inverted.m_x = left->m_x;
  dynamic_inverted.m_y = left->m_y;
  dynamic_inverted.m_z = left->m_z;
  dynamic_inverted.m_w = left->m_w;
  lVar2 = 4;
  lVar1 = 0;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    function = *(GLuint *)((long)combination + lVar1);
    function_00 = combination[lVar2];
    function_01 = *(GLuint *)((long)dynamic_combination + lVar1);
    function_02 = dynamic_combination[lVar2];
    calculate(this,function,&combined,right,&combined);
    calculate(this,function_00,&combined_inverted,right,&combined_inverted);
    calculate(this,function,&constant,right_00,&constant);
    calculate(this,function_00,&constant_inverted,right_00,&constant_inverted);
    calculate(this,function_01,&dynamic,right,&dynamic);
    calculate(this,function_02,&dynamic_inverted,right,&dynamic_inverted);
    lVar1 = lVar1 + 4;
    right_00 = right_00 + 1;
  }
  out_combined->m_x = combined.m_x;
  out_combined->m_y = combined.m_y;
  out_combined->m_z = combined.m_z;
  out_combined->m_w = combined.m_w;
  out_combined_inverted->m_x = combined_inverted.m_x;
  out_combined_inverted->m_y = combined_inverted.m_y;
  out_combined_inverted->m_z = combined_inverted.m_z;
  out_combined_inverted->m_w = combined_inverted.m_w;
  out_constant->m_x = constant.m_x;
  out_constant->m_y = constant.m_y;
  out_constant->m_z = constant.m_z;
  out_constant->m_w = constant.m_w;
  out_constant_inverted->m_x = constant_inverted.m_x;
  out_constant_inverted->m_y = constant_inverted.m_y;
  out_constant_inverted->m_z = constant_inverted.m_z;
  out_constant_inverted->m_w = constant_inverted.m_w;
  out_dynamic->m_x = dynamic.m_x;
  out_dynamic->m_y = dynamic.m_y;
  out_dynamic->m_z = dynamic.m_z;
  out_dynamic->m_w = dynamic.m_w;
  out_dynamic_inverted->m_x = dynamic_inverted.m_x;
  out_dynamic_inverted->m_y = dynamic_inverted.m_y;
  out_dynamic_inverted->m_z = dynamic_inverted.m_z;
  out_dynamic_inverted->m_w = dynamic_inverted.m_w;
  out_loop->m_x = combined.m_x;
  out_loop->m_y = combined.m_y;
  out_loop->m_z = combined.m_z;
  out_loop->m_w = combined.m_w;
  return;
}

Assistant:

void FunctionalTest7_8::calculate(
	const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left, const Utils::vec4<glw::GLfloat>& right,
	const Utils::vec4<glw::GLuint>& indices, Utils::vec4<glw::GLfloat>& out_combined,
	Utils::vec4<glw::GLfloat>& out_combined_inverted, Utils::vec4<glw::GLfloat>& out_constant,
	Utils::vec4<glw::GLfloat>& out_constant_inverted, Utils::vec4<glw::GLfloat>& out_dynamic,
	Utils::vec4<glw::GLfloat>& out_dynamic_inverted, Utils::vec4<glw::GLfloat>& out_loop) const
{
	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Start values */
	Utils::vec4<glw::GLfloat> combined			= left;
	Utils::vec4<glw::GLfloat> combined_inverted = left;
	Utils::vec4<glw::GLfloat> constant			= constant_values[0];
	Utils::vec4<glw::GLfloat> constant_inverted = constant_values[0];
	Utils::vec4<glw::GLfloat> dynamic			= left;
	Utils::vec4<glw::GLfloat> dynamic_inverted  = left;

	/* Calculate expected results */
	for (GLuint i = 0; i < 4; ++i)
	{
		GLuint function					 = combination[i];
		GLuint function_inverted		 = combination[3 - i];
		GLuint dynamic_function			 = dynamic_combination[i];
		GLuint dynamic_function_inverted = dynamic_combination[3 - i];

		calculate(function, combined, right, combined);
		calculate(function_inverted, combined_inverted, right, combined_inverted);
		calculate(function, constant, constant_values[i + 1], constant);
		calculate(function_inverted, constant_inverted, constant_values[i + 1], constant_inverted);
		calculate(dynamic_function, dynamic, right, dynamic);
		calculate(dynamic_function_inverted, dynamic_inverted, right, dynamic_inverted);
	}

	/* Store results */
	out_combined		  = combined;
	out_combined_inverted = combined_inverted;
	out_constant		  = constant;
	out_constant_inverted = constant_inverted;
	out_dynamic			  = dynamic;
	out_dynamic_inverted  = dynamic_inverted;
	out_loop			  = combined;
}